

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O0

DominatorTreeNode * __thiscall
spvtools::opt::DominatorTree::GetOrInsertNode(DominatorTree *this,BasicBlock *bb)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>,_bool>
  pVar3;
  DominatorTreeNode local_b8;
  uint32_t local_84;
  pair<unsigned_int,_spvtools::opt::DominatorTreeNode> local_80;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_> local_48;
  undefined1 local_40;
  _Self local_38;
  uint32_t local_2c;
  _Self local_28;
  iterator node_iter;
  DominatorTreeNode *dtn;
  BasicBlock *bb_local;
  DominatorTree *this_local;
  
  node_iter._M_node = (_Base_ptr)0x0;
  local_2c = BasicBlock::id(bb);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_spvtools::opt::DominatorTreeNode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>_>
       ::find(&this->nodes_,&local_2c);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_spvtools::opt::DominatorTreeNode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>_>
       ::end(&this->nodes_);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    local_84 = BasicBlock::id(bb);
    DominatorTreeNode::DominatorTreeNode(&local_b8,bb);
    std::make_pair<unsigned_int,spvtools::opt::DominatorTreeNode>(&local_80,&local_84,&local_b8);
    pVar3 = std::
            map<unsigned_int,spvtools::opt::DominatorTreeNode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>>
            ::emplace<std::pair<unsigned_int,spvtools::opt::DominatorTreeNode>>
                      ((map<unsigned_int,spvtools::opt::DominatorTreeNode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>>
                        *)&this->nodes_,&local_80);
    local_48 = pVar3.first._M_node;
    local_40 = pVar3.second;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>::
             operator->(&local_48);
    node_iter._M_node = (_Base_ptr)&ppVar2->second;
    std::pair<unsigned_int,_spvtools::opt::DominatorTreeNode>::~pair(&local_80);
    DominatorTreeNode::~DominatorTreeNode(&local_b8);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>::
             operator->(&local_28);
    node_iter._M_node = (_Base_ptr)&ppVar2->second;
  }
  return (DominatorTreeNode *)node_iter._M_node;
}

Assistant:

DominatorTreeNode* DominatorTree::GetOrInsertNode(BasicBlock* bb) {
  DominatorTreeNode* dtn = nullptr;

  std::map<uint32_t, DominatorTreeNode>::iterator node_iter =
      nodes_.find(bb->id());
  if (node_iter == nodes_.end()) {
    dtn = &nodes_.emplace(std::make_pair(bb->id(), DominatorTreeNode{bb}))
               .first->second;
  } else {
    dtn = &node_iter->second;
  }

  return dtn;
}